

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CpuArch.c
# Opt level: O2

BoolInt CPU_IsSupported_SHA(void)

{
  long lVar1;
  UInt32 UVar2;
  uint uVar3;
  
  UVar2 = z7_x86_cpuid_GetMaxFunc();
  uVar3 = 0;
  if (6 < UVar2) {
    lVar1 = cpuid_Extended_Feature_Enumeration_info(7);
    uVar3 = *(uint *)(lVar1 + 4) >> 0x1d & 1;
  }
  return uVar3;
}

Assistant:

BoolInt CPU_IsSupported_SHA(void)
{
  CHECK_SYS_SSE_SUPPORT

  if (z7_x86_cpuid_GetMaxFunc() < 7)
    return False;
  {
    UInt32 d[4];
    z7_x86_cpuid(d, 7);
    return (BoolInt)(d[1] >> 29) & 1;
  }
}